

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void iadst16x16_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  undefined4 in_register_0000008c;
  undefined1 auVar5 [16];
  __m128i alVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int shift;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  __m128i alVar15;
  int iVar16;
  int iVar18;
  int iVar19;
  undefined1 auVar17 [16];
  int iVar20;
  int iVar21;
  int iVar23;
  int iVar24;
  undefined1 auVar22 [16];
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar31;
  int iVar32;
  undefined1 auVar30 [16];
  int iVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i alVar36;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  
  auVar8 = ZEXT416((uint)bit);
  lVar4 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x168);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 600);
  auVar5._4_4_ = uVar1;
  auVar5._0_4_ = uVar1;
  auVar5._8_4_ = uVar1;
  auVar5._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x180);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x240);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x220);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1a0);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar4 + 0x1e0);
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  iVar3 = 1 << ((char)bit - 1U & 0x1f);
  auVar5 = pmulld(auVar5,(undefined1  [16])*in);
  alVar6[0]._0_4_ = auVar5._0_4_ + iVar3 >> auVar8;
  alVar6[0]._4_4_ = auVar5._4_4_ + iVar3 >> auVar8;
  alVar6[1]._0_4_ = auVar5._8_4_ + iVar3 >> auVar8;
  alVar6[1]._4_4_ = auVar5._12_4_ + iVar3 >> auVar8;
  auVar5 = pmulld(auVar14,(undefined1  [16])*in);
  auVar27._0_4_ = iVar3 - auVar5._0_4_ >> auVar8;
  auVar27._4_4_ = iVar3 - auVar5._4_4_ >> auVar8;
  auVar27._8_4_ = iVar3 - auVar5._8_4_ >> auVar8;
  auVar27._12_4_ = iVar3 - auVar5._12_4_ >> auVar8;
  auVar5 = pmulld((undefined1  [16])alVar6,auVar17);
  auVar14 = pmulld(auVar27,auVar30);
  auVar7._0_4_ = auVar5._0_4_ + iVar3 + auVar14._0_4_ >> auVar8;
  auVar7._4_4_ = auVar5._4_4_ + iVar3 + auVar14._4_4_ >> auVar8;
  auVar7._8_4_ = auVar5._8_4_ + iVar3 + auVar14._8_4_ >> auVar8;
  auVar7._12_4_ = auVar5._12_4_ + iVar3 + auVar14._12_4_ >> auVar8;
  auVar14 = pmulld(auVar30,(undefined1  [16])alVar6);
  auVar5 = pmulld(auVar17,auVar27);
  auVar34._0_8_ =
       (__m128i *)
       CONCAT44((auVar14._4_4_ + iVar3) - auVar5._4_4_ >> auVar8,
                (auVar14._0_4_ + iVar3) - auVar5._0_4_ >> auVar8);
  auVar34._8_4_ = (auVar14._8_4_ + iVar3) - auVar5._8_4_ >> auVar8;
  auVar34._12_4_ = (auVar14._12_4_ + iVar3) - auVar5._12_4_ >> auVar8;
  auVar14 = pmulld((undefined1  [16])alVar6,auVar22);
  auVar5 = pmulld(auVar27,auVar26);
  auVar28._0_4_ = auVar14._0_4_ + iVar3 + auVar5._0_4_ >> auVar8;
  auVar28._4_4_ = auVar14._4_4_ + iVar3 + auVar5._4_4_ >> auVar8;
  auVar28._8_4_ = auVar14._8_4_ + iVar3 + auVar5._8_4_ >> auVar8;
  auVar28._12_4_ = auVar14._12_4_ + iVar3 + auVar5._12_4_ >> auVar8;
  auVar14 = pmulld((undefined1  [16])alVar6,auVar26);
  auVar5 = pmulld(auVar22,auVar27);
  alVar15[0]._0_4_ = (auVar14._0_4_ + iVar3) - auVar5._0_4_ >> auVar8;
  alVar15[0]._4_4_ = (auVar14._4_4_ + iVar3) - auVar5._4_4_ >> auVar8;
  alVar15[1]._0_4_ = (auVar14._8_4_ + iVar3) - auVar5._8_4_ >> auVar8;
  alVar15[1]._4_4_ = (auVar14._12_4_ + iVar3) - auVar5._12_4_ >> auVar8;
  auVar35 = pmulld(auVar7,auVar22);
  auVar13 = pmulld(auVar34,auVar26);
  auVar26 = pmulld(auVar26,auVar7);
  auVar5 = pmulld(auVar22,auVar34);
  auVar22 = pmulld((undefined1  [16])alVar6,auVar9);
  auVar14 = pmulld(auVar27,auVar9);
  iVar21 = auVar22._0_4_ + iVar3;
  iVar23 = auVar22._4_4_ + iVar3;
  iVar24 = auVar22._8_4_ + iVar3;
  iVar25 = auVar22._12_4_ + iVar3;
  auVar17 = pmulld(auVar28,auVar9);
  auVar22 = pmulld((undefined1  [16])alVar15,auVar9);
  iVar16 = auVar17._0_4_ + iVar3;
  iVar18 = auVar17._4_4_ + iVar3;
  iVar19 = auVar17._8_4_ + iVar3;
  iVar20 = auVar17._12_4_ + iVar3;
  auVar30 = pmulld(auVar7,auVar9);
  auVar17 = pmulld(auVar34,auVar9);
  iVar29 = auVar30._0_4_ + iVar3;
  iVar31 = auVar30._4_4_ + iVar3;
  iVar32 = auVar30._8_4_ + iVar3;
  iVar33 = auVar30._12_4_ + iVar3;
  alVar36[0]._0_4_ = auVar35._0_4_ + iVar3 + auVar13._0_4_ >> auVar8;
  alVar36[0]._4_4_ = auVar35._4_4_ + iVar3 + auVar13._4_4_ >> auVar8;
  alVar36[1]._0_4_ = auVar35._8_4_ + iVar3 + auVar13._8_4_ >> auVar8;
  alVar36[1]._4_4_ = auVar35._12_4_ + iVar3 + auVar13._12_4_ >> auVar8;
  auVar13._0_4_ = (auVar26._0_4_ + iVar3) - auVar5._0_4_ >> auVar8;
  auVar13._4_4_ = (auVar26._4_4_ + iVar3) - auVar5._4_4_ >> auVar8;
  auVar13._8_4_ = (auVar26._8_4_ + iVar3) - auVar5._8_4_ >> auVar8;
  auVar13._12_4_ = (auVar26._12_4_ + iVar3) - auVar5._12_4_ >> auVar8;
  shift = iVar16 + auVar22._0_4_ >> auVar8;
  auVar5 = pmulld((undefined1  [16])alVar36,auVar9);
  iVar10 = auVar5._0_4_ + iVar3;
  iVar11 = auVar5._4_4_ + iVar3;
  iVar12 = auVar5._8_4_ + iVar3;
  iVar3 = auVar5._12_4_ + iVar3;
  auVar5 = pmulld(auVar9,auVar13);
  if (do_cols == 0) {
    bVar2 = 10;
    if (10 < bd) {
      bVar2 = (byte)bd;
    }
    iVar3 = 0x20 << (bVar2 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar3;
    clamp_hi_out[0]._0_4_ = iVar3 + -1;
    in1[1] = (longlong)clamp_hi_out;
    in1[0] = (longlong)clamp_lo_out;
    in0[1] = (longlong)(out + 1);
    in0[0] = (longlong)out;
    iVar3 = out_shift;
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    neg_shift_sse4_1(in0,in1,(__m128i *)(ulong)(uint)out_shift,
                     (__m128i *)CONCAT44(in_register_0000008c,out_shift),auVar34._0_8_,auVar34._8_8_
                     ,shift);
    in1_00[1] = (longlong)clamp_hi_out;
    in1_00[0] = (longlong)clamp_lo_out;
    in0_00[1] = (longlong)(out + 3);
    in0_00[0] = (longlong)(out + 2);
    neg_shift_sse4_1(in0_00,in1_00,(__m128i *)(ulong)(uint)out_shift,
                     (__m128i *)CONCAT44(in_register_0000008c,iVar3),auVar34._0_8_,auVar34._8_8_,
                     shift);
    in1_01[1] = (longlong)clamp_hi_out;
    in1_01[0] = (longlong)clamp_lo_out;
    in0_01[1] = (longlong)(out + 5);
    in0_01[0] = (longlong)(out + 4);
    neg_shift_sse4_1(in0_01,in1_01,(__m128i *)(ulong)(uint)out_shift,
                     (__m128i *)CONCAT44(in_register_0000008c,iVar3),auVar34._0_8_,auVar34._8_8_,
                     shift);
    in1_02[1] = (longlong)clamp_hi_out;
    in1_02[0] = (longlong)clamp_lo_out;
    in0_02[1] = (longlong)(out + 7);
    in0_02[0] = (longlong)(out + 6);
    neg_shift_sse4_1(in0_02,in1_02,(__m128i *)(ulong)(uint)out_shift,
                     (__m128i *)CONCAT44(in_register_0000008c,iVar3),auVar34._0_8_,auVar34._8_8_,
                     shift);
    in1_03[1] = (longlong)clamp_hi_out;
    in1_03[0] = (longlong)clamp_lo_out;
    in0_03[1] = (longlong)(out + 9);
    in0_03[0] = (longlong)(out + 8);
    neg_shift_sse4_1(in0_03,in1_03,(__m128i *)(ulong)(uint)out_shift,
                     (__m128i *)CONCAT44(in_register_0000008c,iVar3),auVar34._0_8_,auVar34._8_8_,
                     shift);
    in1_04[1] = (longlong)clamp_hi_out;
    in1_04[0] = (longlong)clamp_lo_out;
    in0_04[1] = (longlong)(out + 0xb);
    in0_04[0] = (longlong)(out + 10);
    neg_shift_sse4_1(in0_04,in1_04,(__m128i *)(ulong)(uint)out_shift,
                     (__m128i *)CONCAT44(in_register_0000008c,iVar3),auVar34._0_8_,auVar34._8_8_,
                     shift);
    in1_05[1] = (longlong)clamp_hi_out;
    in1_05[0] = (longlong)clamp_lo_out;
    in0_05[1] = (longlong)(out + 0xd);
    in0_05[0] = (longlong)(out + 0xc);
    neg_shift_sse4_1(in0_05,in1_05,(__m128i *)(ulong)(uint)out_shift,
                     (__m128i *)CONCAT44(in_register_0000008c,iVar3),auVar34._0_8_,auVar34._8_8_,
                     shift);
    in1_06[1] = (longlong)clamp_hi_out;
    in1_06[0] = (longlong)clamp_lo_out;
    in0_06[1] = (longlong)(out + 0xf);
    in0_06[0] = (longlong)(out + 0xe);
    neg_shift_sse4_1(in0_06,in1_06,(__m128i *)(ulong)(uint)out_shift,
                     (__m128i *)CONCAT44(in_register_0000008c,iVar3),auVar34._0_8_,auVar34._8_8_,
                     shift);
  }
  else {
    *out = alVar6;
    *(int *)out[1] = -auVar7._0_4_;
    *(int *)((long)out[1] + 4) = -auVar7._4_4_;
    *(int *)(out[1] + 1) = -auVar7._8_4_;
    *(int *)((long)out[1] + 0xc) = -auVar7._12_4_;
    out[2] = alVar36;
    *(int *)out[3] = -auVar28._0_4_;
    *(int *)((long)out[3] + 4) = -auVar28._4_4_;
    *(int *)(out[3] + 1) = -auVar28._8_4_;
    *(int *)((long)out[3] + 0xc) = -auVar28._12_4_;
    out[4][0] = CONCAT44(iVar18 + auVar22._4_4_ >> auVar8,shift);
    out[4][1] = CONCAT44(iVar20 + auVar22._12_4_ >> auVar8,iVar19 + auVar22._8_4_ >> auVar8);
    *(int *)out[5] = -(iVar10 + auVar5._0_4_ >> auVar8);
    *(int *)((long)out[5] + 4) = -(iVar11 + auVar5._4_4_ >> auVar8);
    *(int *)(out[5] + 1) = -(iVar12 + auVar5._8_4_ >> auVar8);
    *(int *)((long)out[5] + 0xc) = -(iVar3 + auVar5._12_4_ >> auVar8);
    out[6][0] = CONCAT44(iVar31 + auVar17._4_4_ >> auVar8,iVar29 + auVar17._0_4_ >> auVar8);
    out[6][1] = CONCAT44(iVar33 + auVar17._12_4_ >> auVar8,iVar32 + auVar17._8_4_ >> auVar8);
    *(int *)out[7] = -(iVar21 + auVar14._0_4_ >> auVar8);
    *(int *)((long)out[7] + 4) = -(iVar23 + auVar14._4_4_ >> auVar8);
    *(int *)(out[7] + 1) = -(iVar24 + auVar14._8_4_ >> auVar8);
    *(int *)((long)out[7] + 0xc) = -(iVar25 + auVar14._12_4_ >> auVar8);
    *(int *)out[8] = iVar21 - auVar14._0_4_ >> auVar8;
    *(int *)((long)out[8] + 4) = iVar23 - auVar14._4_4_ >> auVar8;
    *(int *)(out[8] + 1) = iVar24 - auVar14._8_4_ >> auVar8;
    *(int *)((long)out[8] + 0xc) = iVar25 - auVar14._12_4_ >> auVar8;
    *(int *)out[9] = -(iVar29 - auVar17._0_4_ >> auVar8);
    *(int *)((long)out[9] + 4) = -(iVar31 - auVar17._4_4_ >> auVar8);
    *(int *)(out[9] + 1) = -(iVar32 - auVar17._8_4_ >> auVar8);
    *(int *)((long)out[9] + 0xc) = -(iVar33 - auVar17._12_4_ >> auVar8);
    *(int *)out[10] = iVar10 - auVar5._0_4_ >> auVar8;
    *(int *)((long)out[10] + 4) = iVar11 - auVar5._4_4_ >> auVar8;
    *(int *)(out[10] + 1) = iVar12 - auVar5._8_4_ >> auVar8;
    *(int *)((long)out[10] + 0xc) = iVar3 - auVar5._12_4_ >> auVar8;
    *(int *)out[0xb] = -(iVar16 - auVar22._0_4_ >> auVar8);
    *(int *)((long)out[0xb] + 4) = -(iVar18 - auVar22._4_4_ >> auVar8);
    *(int *)(out[0xb] + 1) = -(iVar19 - auVar22._8_4_ >> auVar8);
    *(int *)((long)out[0xb] + 0xc) = -(iVar20 - auVar22._12_4_ >> auVar8);
    out[0xc] = alVar15;
    *(int *)out[0xd] = -auVar13._0_4_;
    *(int *)((long)out[0xd] + 4) = -auVar13._4_4_;
    *(int *)(out[0xd] + 1) = -auVar13._8_4_;
    *(int *)((long)out[0xd] + 0xc) = -auVar13._12_4_;
    out[0xe][0] = (longlong)auVar34._0_8_;
    out[0xe][1] = (longlong)auVar34._8_8_;
    *(int *)out[0xf] = -auVar27._0_4_;
    *(int *)((long)out[0xf] + 4) = -auVar27._4_4_;
    *(int *)(out[0xf] + 1) = -auVar27._8_4_;
    *(int *)((long)out[0xf] + 0xc) = -auVar27._12_4_;
  }
  return;
}

Assistant:

static void iadst16x16_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i zero = _mm_setzero_si128();
  __m128i v[16], x, y, temp1, temp2;
  // stage 0
  // stage 1
  // stage 2
  x = _mm_mullo_epi32(in[0], cospi62);
  v[0] = _mm_add_epi32(x, rnding);
  v[0] = _mm_srai_epi32(v[0], bit);

  x = _mm_mullo_epi32(in[0], cospi2);
  v[1] = _mm_sub_epi32(zero, x);
  v[1] = _mm_add_epi32(v[1], rnding);
  v[1] = _mm_srai_epi32(v[1], bit);

  // stage 3
  v[8] = v[0];
  v[9] = v[1];

  // stage 4
  temp1 = _mm_mullo_epi32(v[8], cospi8);
  x = _mm_mullo_epi32(v[9], cospi56);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[8], cospi56);
  x = _mm_mullo_epi32(v[9], cospi8);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[8] = temp1;
  v[9] = temp2;

  // stage 5
  v[4] = v[0];
  v[5] = v[1];
  v[12] = v[8];
  v[13] = v[9];

  // stage 6
  temp1 = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[4] = temp1;
  v[5] = temp2;

  temp1 = _mm_mullo_epi32(v[12], cospi16);
  x = _mm_mullo_epi32(v[13], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[12], cospi48);
  x = _mm_mullo_epi32(v[13], cospi16);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[12] = temp1;
  v[13] = temp2;

  // stage 7
  v[2] = v[0];
  v[3] = v[1];
  v[6] = v[4];
  v[7] = v[5];
  v[10] = v[8];
  v[11] = v[9];
  v[14] = v[12];
  v[15] = v[13];

  // stage 8
  y = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  v[2] = _mm_add_epi32(y, x);
  v[2] = _mm_add_epi32(v[2], rnding);
  v[2] = _mm_srai_epi32(v[2], bit);

  v[3] = _mm_sub_epi32(y, x);
  v[3] = _mm_add_epi32(v[3], rnding);
  v[3] = _mm_srai_epi32(v[3], bit);

  y = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  v[6] = _mm_add_epi32(y, x);
  v[6] = _mm_add_epi32(v[6], rnding);
  v[6] = _mm_srai_epi32(v[6], bit);

  v[7] = _mm_sub_epi32(y, x);
  v[7] = _mm_add_epi32(v[7], rnding);
  v[7] = _mm_srai_epi32(v[7], bit);

  y = _mm_mullo_epi32(v[10], cospi32);
  x = _mm_mullo_epi32(v[11], cospi32);
  v[10] = _mm_add_epi32(y, x);
  v[10] = _mm_add_epi32(v[10], rnding);
  v[10] = _mm_srai_epi32(v[10], bit);

  v[11] = _mm_sub_epi32(y, x);
  v[11] = _mm_add_epi32(v[11], rnding);
  v[11] = _mm_srai_epi32(v[11], bit);

  y = _mm_mullo_epi32(v[14], cospi32);
  x = _mm_mullo_epi32(v[15], cospi32);
  v[14] = _mm_add_epi32(y, x);
  v[14] = _mm_add_epi32(v[14], rnding);
  v[14] = _mm_srai_epi32(v[14], bit);

  v[15] = _mm_sub_epi32(y, x);
  v[15] = _mm_add_epi32(v[15], rnding);
  v[15] = _mm_srai_epi32(v[15], bit);

  // stage 9
  if (do_cols) {
    out[0] = v[0];
    out[1] = _mm_sub_epi32(zero, v[8]);
    out[2] = v[12];
    out[3] = _mm_sub_epi32(zero, v[4]);
    out[4] = v[6];
    out[5] = _mm_sub_epi32(zero, v[14]);
    out[6] = v[10];
    out[7] = _mm_sub_epi32(zero, v[2]);
    out[8] = v[3];
    out[9] = _mm_sub_epi32(zero, v[11]);
    out[10] = v[15];
    out[11] = _mm_sub_epi32(zero, v[7]);
    out[12] = v[5];
    out[13] = _mm_sub_epi32(zero, v[13]);
    out[14] = v[9];
    out[15] = _mm_sub_epi32(zero, v[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(v[0], v[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(v[12], v[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[6], v[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[10], v[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[3], v[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[15], v[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[5], v[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[9], v[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}